

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Safaia.h
# Opt level: O2

void __thiscall Safaia::Server::loop(Server *this)

{
  int iVar1;
  int i;
  int iVar2;
  long lVar3;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  reference_wrapper<Safaia::Resp> local_78;
  reference_wrapper<std::vector<Safaia::Route,_std::allocator<Safaia::Route>_>_> local_70;
  reference_wrapper<bool> local_68;
  reference_wrapper<Safaia::Log> local_60;
  reference_wrapper<int> local_58;
  thread local_50;
  vector<std::thread,_std::allocator<std::thread>_> local_48;
  
  local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (iVar2 = 0; iVar1 = this->thread, iVar2 < iVar1; iVar2 = iVar2 + 1) {
    local_60._M_data = (Log *)logger;
    local_78._M_data = &this->not_found;
    local_70._M_data = &this->vec_routes;
    local_68._M_data = &this->soft_stop;
    local_58._M_data = &this->sockfd;
    std::thread::
    thread<void(&)(int,Safaia::Log&,bool&,std::vector<Safaia::Route,std::allocator<Safaia::Route>>&,Safaia::Resp&),std::reference_wrapper<int>,std::reference_wrapper<Safaia::Log>,std::reference_wrapper<bool>,std::reference_wrapper<std::vector<Safaia::Route,std::allocator<Safaia::Route>>>,std::reference_wrapper<Safaia::Resp>,void>
              (&local_50,serve,&local_58,&local_60,&local_68,&local_70,&local_78);
    std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
              (&local_48,&local_50);
    std::thread::~thread(&local_50);
  }
  for (lVar3 = 0; lVar3 < iVar1; lVar3 = lVar3 + 1) {
    std::thread::join();
    iVar1 = this->thread;
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_48);
  return;
}

Assistant:

void loop(){
            std::vector<std::thread> threads;
            for (int i = 0; i < thread; i++){
                threads.push_back(std::thread(serve, std::ref(sockfd), std::ref(logger), std::ref(soft_stop), std::ref(vec_routes), std::ref(not_found)));
            }
            for (int i = 0; i < thread; i++){
                threads[i].join();
            }

        }